

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

DeviceData * __thiscall
QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::operator[]
          (QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *this,QPaintDevice **key)

{
  DeviceData *pDVar1;
  long in_FS_OFFSET;
  QPaintDevice **in_stack_ffffffffffffffb8;
  QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pDVar1 = iterator::operator*((iterator *)0x9dfa93);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pDVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }